

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O1

uint32_t __thiscall xray_re::xr_level_ai::vertex_id(xr_level_ai *this,fvector3 *position)

{
  float fVar1;
  ai_node *paVar2;
  ulong uVar3;
  ai_node *paVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t uVar7;
  long lVar8;
  ai_node *node;
  float fVar9;
  float fVar10;
  ai_node sample;
  uint local_38;
  uint16_t local_34 [2];
  
  vertex_position(this,&local_38,local_34,position);
  paVar2 = this->m_nodes;
  uVar3 = (ulong)this->m_num_nodes;
  paVar4 = paVar2 + uVar3;
  node = paVar2;
  if (uVar3 != 0) {
    do {
      uVar5 = uVar3 >> 1;
      uVar6 = uVar5;
      if (node[uVar5].packed_xz < local_38) {
        uVar6 = ~uVar5 + uVar3;
        node = node + uVar5 + 1;
      }
      uVar3 = uVar6;
    } while (0 < (long)uVar6);
  }
  uVar7 = 0xffffffff;
  if ((node != paVar4) && (node->packed_xz == local_38)) {
    lVar8 = ((long)node - (long)paVar2 >> 2) * 0x6db6db6db6db6db7;
    uVar7 = (uint32_t)lVar8;
    fVar9 = vertex_plane_y(this,node,(position->field_0).field_0.x,(position->field_0).field_0.z);
    paVar2 = node;
    while (paVar2 = paVar2 + 1, paVar2 != paVar4) {
      node = node + 1;
      if (paVar2->packed_xz != local_38) {
        return (uint32_t)lVar8;
      }
      fVar10 = vertex_plane_y(this,paVar2,(position->field_0).field_0.x,
                              (position->field_0).field_0.z);
      fVar1 = (position->field_0).field_0.y;
      if (fVar9 <= fVar1) {
        if ((fVar10 <= fVar1) && (fVar1 - fVar10 < fVar1 - fVar9)) goto LAB_00167cb4;
      }
      else if ((fVar10 <= fVar1) || (fVar10 - fVar1 < fVar9 - fVar1)) {
LAB_00167cb4:
        lVar8 = ((long)node - (long)this->m_nodes >> 2) * 0x6db6db6db6db6db7;
        fVar9 = fVar10;
      }
      uVar7 = (uint32_t)lVar8;
    }
  }
  return uVar7;
}

Assistant:

uint32_t xr_level_ai::vertex_id(const fvector3& position) const
{
	ai_node sample;
	vertex_position(sample.packed_xz, sample.packed_y, position);
	const ai_node* end = m_nodes + m_num_nodes;
	const ai_node* it = std::lower_bound(static_cast<const ai_node*>(m_nodes), end, sample);
	if (it == end || it->packed_xz != sample.packed_xz)
		return AI_MAP_BAD_NODE;

	size_t node_id = it - m_nodes;
	float y0 = vertex_plane_y(*it, position.x, position.z);
	while (++it != end && it->packed_xz == sample.packed_xz) {
		float y = vertex_plane_y(*it, position.x, position.z);
		if (position.y < y0) {
			if (position.y < y && (y0 - position.y) <= (y - position.y))
				continue;
		} else if (position.y < y || (position.y - y0) <= (position.y - y)) {
			continue;
		}
		node_id = it - m_nodes;
		y0 = y;
	}
	return uint32_t(node_id & UINT32_MAX);
}